

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Phi(PortalImageInfiniteLight *this,SampledWavelengths *lambda)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  RGB *pRVar5;
  ulong uVar6;
  long lVar7;
  int c;
  int c_00;
  Point2i p;
  Float FVar8;
  undefined1 auVar12 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  SampledSpectrum SVar17;
  int local_e8;
  Float duv_dw;
  undefined1 local_d8 [8];
  undefined1 local_d0 [16];
  long local_c0;
  SampledWavelengths *local_b8;
  ulong local_b0;
  Tuple2<pbrt::Point2,_float> local_a8;
  WrapMode2D local_a0;
  SampledSpectrum sumL;
  SampledSpectrum local_78;
  SampledSpectrum local_68;
  undefined1 local_58 [2] [16];
  undefined1 auVar16 [56];
  
  local_b8 = lambda;
  SampledSpectrum::SampledSpectrum(&sumL,0.0);
  TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  lVar7 = 0;
  local_d0._8_8_ = this;
  while (uVar3 = local_d0._8_8_, auVar12 = in_ZMM1._8_56_, lVar7 < (long)TVar4 >> 0x20) {
    local_b0 = lVar7 << 0x20;
    local_c0 = lVar7;
    for (uVar6 = 0; (long)uVar6 < (long)TVar4.x; uVar6 = uVar6 + 1) {
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      local_d0._0_4_ = 0.0;
      p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_b0 | uVar6);
      for (c_00 = 0; uVar3 = local_d0._8_8_, c_00 != 3; c_00 = c_00 + 1) {
        WrapMode2D::WrapMode2D(&local_a0,Clamp);
        FVar8 = Image::GetChannel(&this->image,p,c_00,local_a0);
        pRVar5 = (RGB *)local_d8;
        if ((c_00 != 0) && (pRVar5 = (RGB *)(local_d8 + 4), c_00 != 1)) {
          pRVar5 = (RGB *)local_d0;
        }
        pRVar5->r = FVar8;
      }
      local_e8 = (int)uVar6;
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           (((Image *)(local_d0._8_8_ + 0xb8))->resolution).super_Tuple2<pbrt::Point2,_int>;
      auVar2 = vinsertps_avx(ZEXT416((uint)((float)local_e8 + 0.5)),
                             ZEXT416((uint)((float)(int)lVar7 + 0.5)),0x10);
      auVar13 = vcvtdq2ps_avx(auVar13);
      auVar16 = ZEXT856(auVar13._8_8_);
      auVar13 = vdivps_avx(auVar2,auVar13);
      auVar12 = ZEXT856(auVar13._8_8_);
      local_a8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar13);
      RenderFromImage((PortalImageInfiniteLight *)local_d0._8_8_,(Point2f *)&local_a8,&duv_dw);
      RGBSpectrum::RGBSpectrum
                ((RGBSpectrum *)local_58,*(RGBColorSpace **)(uVar3 + 0x1d0),(RGB *)local_d8);
      SVar17 = RGBSpectrum::Sample((RGBSpectrum *)local_58,local_b8);
      auVar14._0_8_ = SVar17.values.values._8_8_;
      auVar14._8_56_ = auVar16;
      auVar9._0_8_ = SVar17.values.values._0_8_;
      auVar9._8_56_ = auVar12;
      local_78.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar14._0_16_);
      auVar12 = (undefined1  [56])0x0;
      SVar17 = SampledSpectrum::operator/(&local_78,duv_dw);
      in_ZMM1._0_8_ = SVar17.values.values._8_8_;
      in_ZMM1._8_56_ = auVar16;
      auVar10._0_8_ = SVar17.values.values._0_8_;
      auVar10._8_56_ = auVar12;
      local_68.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,in_ZMM1._0_16_);
      SampledSpectrum::operator+=(&sumL,&local_68);
      TVar4 = (((Image *)(uVar3 + 0xb8))->resolution).super_Tuple2<pbrt::Point2,_int>;
    }
    lVar7 = local_c0 + 1;
  }
  fVar1 = *(Float *)(local_d0._8_8_ + 0x1d8);
  FVar8 = Area((PortalImageInfiniteLight *)local_d0._8_8_);
  auVar16 = (undefined1  [56])0x0;
  SVar17 = SampledSpectrum::operator*(&sumL,FVar8 * fVar1);
  auVar15._0_8_ = SVar17.values.values._8_8_;
  auVar15._8_56_ = auVar12;
  auVar11._0_8_ = SVar17.values.values._0_8_;
  auVar11._8_56_ = auVar16;
  local_58[0] = vmovlhps_avx(auVar11._0_16_,auVar15._0_16_);
  TVar4 = (((Image *)(uVar3 + 0xb8))->resolution).super_Tuple2<pbrt::Point2,_int>;
  SVar17 = SampledSpectrum::operator/((SampledSpectrum *)local_58,(float)(TVar4.y * TVar4.x));
  return (array<float,_4>)(array<float,_4>)SVar17;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    // We're really computing fluence, then converting to power, for what
    // that's worth..
    SampledSpectrum sumL(0.);

    for (int y = 0; y < image.Resolution().y; ++y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({x, y}, c);

            Point2f st((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);
            Float duv_dw;
            (void)RenderFromImage(st, &duv_dw);

            sumL += RGBSpectrum(*imageColorSpace, rgb).Sample(lambda) / duv_dw;
        }
    }

    return scale * Area() * sumL / (image.Resolution().x * image.Resolution().y);
}